

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

Vec_Ptr_t * Llb_Nonlin4DerivePartitions(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  int iVar1;
  DdNode *pDVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  void *pvVar4;
  DdNode *n;
  int iVar5;
  
  Aig_ManCleanData(pAig);
  pDVar2 = Cudd_ReadOne(dd);
  (pAig->pConst1->field_5).pData = pDVar2;
  for (iVar5 = 0; iVar5 < pAig->vCis->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar5);
    iVar1 = Llb_ObjBddVar(vOrder,pAVar3);
    pDVar2 = Cudd_bddIthVar(dd,iVar1);
    (pAVar3->field_5).pData = pDVar2;
  }
  for (iVar5 = 0; iVar5 < pAig->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar5);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) &&
       (iVar1 = Llb_ObjBddVar(vOrder,pAVar3), -1 < iVar1)) {
      iVar1 = Llb_ObjBddVar(vOrder,pAVar3);
      pDVar2 = Cudd_bddIthVar(dd,iVar1);
      (pAVar3->field_5).pData = pDVar2;
      Cudd_Ref(pDVar2);
    }
  }
  for (iVar5 = 0; iVar5 < pAig->nRegs; iVar5 = iVar5 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar5);
    iVar1 = Llb_ObjBddVar(vOrder,pAVar3);
    pDVar2 = Cudd_bddIthVar(dd,iVar1);
    (pAVar3->field_5).pData = pDVar2;
  }
  p = Vec_PtrAlloc(100);
  for (iVar5 = 0; iVar5 < pAig->vObjs->nSize; iVar5 = iVar5 + 1) {
    pvVar4 = Vec_PtrEntry(pAig->vObjs,iVar5);
    if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
      pDVar2 = Cudd_bddAnd(dd,(DdNode *)
                              ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^
                              *(ulong *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x28)
                              ),(DdNode *)
                                ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^
                                *(ulong *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) +
                                          0x28)));
      if (pDVar2 == (DdNode *)0x0) goto LAB_0066d3ac;
      Cudd_Ref(pDVar2);
      if (*(DdNode **)((long)pvVar4 + 0x28) == (DdNode *)0x0) {
        *(DdNode **)((long)pvVar4 + 0x28) = pDVar2;
      }
      else {
        n = Cudd_bddXnor(dd,*(DdNode **)((long)pvVar4 + 0x28),pDVar2);
        if (n == (DdNode *)0x0) goto LAB_0066d3ac;
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar2);
        Vec_PtrPush(p,n);
      }
    }
  }
  iVar5 = 0;
  while( true ) {
    if (pAig->nRegs <= iVar5) {
      for (iVar5 = 0; iVar5 < pAig->vObjs->nSize; iVar5 = iVar5 + 1) {
        pvVar4 = Vec_PtrEntry(pAig->vObjs,iVar5);
        if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 0x28));
        }
      }
      return p;
    }
    pvVar4 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar5);
    pDVar2 = Cudd_bddXnor(dd,*(DdNode **)((long)pvVar4 + 0x28),
                          (DdNode *)
                          ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^
                          *(ulong *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x28)));
    if (pDVar2 == (DdNode *)0x0) break;
    Cudd_Ref(pDVar2);
    Vec_PtrPush(p,pDVar2);
    iVar5 = iVar5 + 1;
  }
LAB_0066d3ac:
  for (iVar5 = 0; iVar5 < pAig->vObjs->nSize; iVar5 = iVar5 + 1) {
    pvVar4 = Vec_PtrEntry(pAig->vObjs,iVar5);
    if (((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) &&
       (*(DdNode **)((long)pvVar4 + 0x28) != (DdNode *)0x0)) {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 0x28));
    }
  }
  iVar5 = p->nSize;
  iVar1 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != iVar1; iVar1 = iVar1 + 1) {
    pDVar2 = (DdNode *)Vec_PtrEntry(p,iVar1);
    Cudd_RecursiveDeref(dd,pDVar2);
  }
  Vec_PtrFree(p);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4DerivePartitions( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    Vec_Ptr_t * vRoots;
    Aig_Obj_t * pObj;
    DdNode * bBdd, * bBdd0, * bBdd1, * bPart;
    int i;
    Aig_ManCleanData( pAig );
    // assign elementary variables
    Aig_ManConst1(pAig)->pData = Cudd_ReadOne(dd); 
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) >= 0 )
        {
            pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
            Cudd_Ref( (DdNode *)pObj->pData );
        }
    Saig_ManForEachLi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // compute intermediate BDDs
    vRoots = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( bBdd == NULL )
            goto finish;
        Cudd_Ref( bBdd );
        if ( pObj->pData == NULL )
        {
            pObj->pData = bBdd;
            continue;
        }
        // create new partition
        bPart = Cudd_bddXnor( dd, (DdNode *)pObj->pData, bBdd );  
        if ( bPart == NULL )
            goto finish;
        Cudd_Ref( bPart );
        Cudd_RecursiveDeref( dd, bBdd );
        Vec_PtrPush( vRoots, bPart );
//printf( "%d ", Cudd_DagSize(bPart) );
    }
    // compute register output BDDs
    Saig_ManForEachLi( pAig, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bPart = Cudd_bddXnor( dd, (DdNode *)pObj->pData, bBdd0 );  
        if ( bPart == NULL )
            goto finish;
        Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
//printf( "%d ", Cudd_DagSize(bPart) );
    }
//printf( "\n" );
    Aig_ManForEachNode( pAig, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    return vRoots;
    // early termination
finish:
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Vec_PtrForEachEntry( DdNode *, vRoots, bPart, i )
        Cudd_RecursiveDeref( dd, bPart );
    Vec_PtrFree( vRoots );
    return NULL;
}